

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

bool __thiscall cmComputeLinkInformation::Compute(cmComputeLinkInformation *this)

{
  cmGeneratorTarget *pcVar1;
  cmake *this_00;
  bool bVar2;
  TargetType TVar3;
  ulong uVar4;
  pointer pLVar5;
  pointer pLVar6;
  char *pcVar7;
  reference ppcVar8;
  ostream *poVar9;
  PolicyID id;
  bool local_5b1;
  cmListFileBacktrace local_550;
  string local_510;
  string local_4f0;
  string local_4d0;
  undefined1 local_4b0 [8];
  ostringstream w;
  undefined1 local_330 [8];
  string lib;
  bool implib;
  cmGeneratorTarget *tgt;
  _Self local_2f8;
  const_iterator i;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *wrongItems;
  string local_2e0;
  char *local_2c0;
  char *lss;
  __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
  local_2b0;
  const_iterator lei;
  EntryVector *linkEntries;
  undefined1 local_290 [8];
  cmComputeLinkDepends cld;
  cmComputeLinkInformation *this_local;
  
  cld._624_8_ = this;
  TVar3 = cmGeneratorTarget::GetType(this->Target);
  if ((((TVar3 == EXECUTABLE) ||
       (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == SHARED_LIBRARY)) ||
      (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == MODULE_LIBRARY)) ||
     (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == STATIC_LIBRARY)) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cmComputeLinkDepends::cmComputeLinkDepends
                ((cmComputeLinkDepends *)local_290,this->Target,&this->Config);
      cmComputeLinkDepends::SetOldLinkDirMode
                ((cmComputeLinkDepends *)local_290,(bool)(this->OldLinkDirMode & 1));
      lei._M_current = (LinkEntry *)cmComputeLinkDepends::Compute((cmComputeLinkDepends *)local_290)
      ;
      local_2b0._M_current =
           (LinkEntry *)
           std::
           vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ::begin((vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    *)lei._M_current);
      while( true ) {
        lss = (char *)std::
                      vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ::end((vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                             *)lei._M_current);
        bVar2 = __gnu_cxx::operator!=
                          (&local_2b0,
                           (__normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                            *)&lss);
        if (!bVar2) break;
        pLVar5 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                 ::operator->(&local_2b0);
        if ((pLVar5->IsSharedDep & 1U) == 0) {
          pLVar5 = __gnu_cxx::
                   __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                   ::operator->(&local_2b0);
          pLVar6 = __gnu_cxx::
                   __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                   ::operator->(&local_2b0);
          AddItem(this,&pLVar5->Item,pLVar6->Target);
        }
        else {
          pLVar5 = __gnu_cxx::
                   __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                   ::operator->(&local_2b0);
          pLVar6 = __gnu_cxx::
                   __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                   ::operator->(&local_2b0);
          AddSharedDepItem(this,&pLVar5->Item,pLVar6->Target);
        }
        __gnu_cxx::
        __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
        ::operator++(&local_2b0);
      }
      pcVar1 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2e0,"LINK_SEARCH_END_STATIC",(allocator *)((long)&wrongItems + 7))
      ;
      pcVar7 = cmGeneratorTarget::GetProperty(pcVar1,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&wrongItems + 7));
      local_2c0 = pcVar7;
      bVar2 = cmSystemTools::IsOn(pcVar7);
      if (bVar2) {
        SetCurrentLinkType(this,LinkStatic);
      }
      else {
        SetCurrentLinkType(this,this->StartLinkType);
      }
      if ((this->OldLinkDirMode & 1U) != 0) {
        i._M_node = (_Base_ptr)
                    cmComputeLinkDepends::GetOldWrongConfigItems((cmComputeLinkDepends *)local_290);
        local_2f8._M_node =
             (_Base_ptr)
             std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::begin((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                      *)i._M_node);
        while( true ) {
          tgt = (cmGeneratorTarget *)
                std::
                set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                ::end((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                       *)i._M_node);
          bVar2 = std::operator!=(&local_2f8,(_Self *)&tgt);
          if (!bVar2) break;
          ppcVar8 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&local_2f8);
          pcVar1 = *ppcVar8;
          local_5b1 = false;
          if ((this->UseImportLibrary & 1U) != 0) {
            TVar3 = cmGeneratorTarget::GetType(pcVar1);
            local_5b1 = TVar3 == SHARED_LIBRARY;
          }
          lib.field_2._M_local_buf[0xf] = local_5b1;
          cmGeneratorTarget::GetFullPath((string *)local_330,pcVar1,&this->Config,local_5b1,true);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->OldLinkDirItems,(value_type *)local_330);
          std::__cxx11::string::~string((string *)local_330);
          std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&local_2f8);
        }
      }
      bVar2 = FinishLinkerSearchDirectories(this);
      if (bVar2) {
        AddImplicitLinkInfo(this);
        bVar2 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->CMP0060WarnItems);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_4d0,(cmPolicies *)0x3c,id);
          poVar9 = std::operator<<((ostream *)local_4b0,(string *)&local_4d0);
          poVar9 = std::operator<<(poVar9,
                                   "\nSome library files are in directories implicitly searched by the linker when invoked for "
                                  );
          poVar9 = std::operator<<(poVar9,(string *)&this->LinkLanguage);
          poVar9 = std::operator<<(poVar9,":\n ");
          cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_4f0,&this->CMP0060WarnItems,"\n ");
          poVar9 = std::operator<<(poVar9,(string *)&local_4f0);
          std::operator<<(poVar9,
                          "\nFor compatibility with older versions of CMake, the generated link line will ask the linker to search for these by library name."
                         );
          std::__cxx11::string::~string((string *)&local_4f0);
          std::__cxx11::string::~string((string *)&local_4d0);
          this_00 = this->CMakeInstance;
          std::__cxx11::ostringstream::str();
          cmGeneratorTarget::GetBacktrace(&local_550,this->Target);
          cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_510,&local_550,false);
          cmListFileBacktrace::~cmListFileBacktrace(&local_550);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      cmComputeLinkDepends::~cmComputeLinkDepends((cmComputeLinkDepends *)local_290);
    }
    else {
      cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error
                ("CMake can not determine linker language for target: ",pcVar7,(char *)0x0,
                 (char *)0x0);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmComputeLinkInformation::Compute()
{
  // Skip targets that do not link.
  if(!(this->Target->GetType() == cmState::EXECUTABLE ||
       this->Target->GetType() == cmState::SHARED_LIBRARY ||
       this->Target->GetType() == cmState::MODULE_LIBRARY ||
       this->Target->GetType() == cmState::STATIC_LIBRARY))
    {
    return false;
    }

  // We require a link language for the target.
  if(this->LinkLanguage.empty())
    {
    cmSystemTools::
      Error("CMake can not determine linker language for target: ",
            this->Target->GetName().c_str());
    return false;
    }

  // Compute the ordered link line items.
  cmComputeLinkDepends cld(this->Target, this->Config);
  cld.SetOldLinkDirMode(this->OldLinkDirMode);
  cmComputeLinkDepends::EntryVector const& linkEntries = cld.Compute();

  // Add the link line items.
  for(cmComputeLinkDepends::EntryVector::const_iterator
        lei = linkEntries.begin();
      lei != linkEntries.end(); ++lei)
    {
    if(lei->IsSharedDep)
      {
      this->AddSharedDepItem(lei->Item, lei->Target);
      }
    else
      {
      this->AddItem(lei->Item, lei->Target);
      }
    }

  // Restore the target link type so the correct system runtime
  // libraries are found.
  const char* lss =
      this->Target->GetProperty("LINK_SEARCH_END_STATIC");
  if(cmSystemTools::IsOn(lss))
    {
    this->SetCurrentLinkType(LinkStatic);
    }
  else
    {
    this->SetCurrentLinkType(this->StartLinkType);
    }

  // Finish listing compatibility paths.
  if(this->OldLinkDirMode)
    {
    // For CMake 2.4 bug-compatibility we need to consider the output
    // directories of targets linked in another configuration as link
    // directories.
    std::set<cmGeneratorTarget const*> const& wrongItems =
        cld.GetOldWrongConfigItems();
    for(std::set<cmGeneratorTarget const*>::const_iterator i =
        wrongItems.begin(); i != wrongItems.end(); ++i)
      {
      cmGeneratorTarget const* tgt = *i;
      bool implib =
        (this->UseImportLibrary &&
         (tgt->GetType() == cmState::SHARED_LIBRARY));
      std::string lib = tgt->GetFullPath(this->Config , implib, true);
      this->OldLinkDirItems.push_back(lib);
      }
    }

  // Finish setting up linker search directories.
  if(!this->FinishLinkerSearchDirectories())
    {
    return false;
    }

  // Add implicit language runtime libraries and directories.
  this->AddImplicitLinkInfo();

  if (!this->CMP0060WarnItems.empty())
    {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0060) << "\n"
      "Some library files are in directories implicitly searched by "
      "the linker when invoked for " << this->LinkLanguage << ":\n"
      " " << cmJoin(this->CMP0060WarnItems, "\n ") << "\n"
      "For compatibility with older versions of CMake, the generated "
      "link line will ask the linker to search for these by library "
      "name."
      ;
    this->CMakeInstance->IssueMessage(cmake::AUTHOR_WARNING, w.str(),
                                      this->Target->GetBacktrace());
    }

  return true;
}